

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O0

int tnt_reply0(tnt_reply *r,char *buf,size_t size,size_t *off)

{
  int iVar1;
  size_t local_50;
  size_t hdr_length;
  size_t data_length;
  char *data;
  size_t length;
  size_t *off_local;
  size_t size_local;
  char *buf_local;
  tnt_reply *r_local;
  
  length = (size_t)off;
  off_local = (size_t *)size;
  size_local = (size_t)buf;
  buf_local = (char *)r;
  iVar1 = tnt_reply_len(buf,size,(size_t *)&data);
  if (iVar1 == 0) {
    if (buf_local == (char *)0x0) {
      if (length != 0) {
        *(char **)length = data;
      }
      r_local._4_4_ = 0;
    }
    else {
      data_length = size_local + 5;
      hdr_length = (size_t)(data + -5);
      iVar1 = tnt_reply_hdr0((tnt_reply *)buf_local,(char *)data_length,hdr_length,&local_50);
      if (iVar1 == 0) {
        if ((hdr_length == local_50) ||
           (iVar1 = tnt_reply_body0((tnt_reply *)buf_local,(char *)(data_length + local_50),
                                    hdr_length - local_50,(size_t *)0x0), iVar1 == 0)) {
          if (length != 0) {
            *(char **)length = data;
          }
          r_local._4_4_ = 0;
        }
        else {
          r_local._4_4_ = -1;
        }
      }
      else {
        r_local._4_4_ = -1;
      }
    }
  }
  else if (iVar1 == 1) {
    if (length != 0) {
      *(char **)length = data;
    }
    r_local._4_4_ = 1;
  }
  else {
    r_local._4_4_ = -1;
  }
  return r_local._4_4_;
}

Assistant:

int
tnt_reply0(struct tnt_reply *r, const char *buf, size_t size, size_t *off) {
	/* supplied buffer must contain full reply,
	 * if it doesn't then returning count of bytes
	 * needed to process */
	size_t length;
	switch (tnt_reply_len(buf, size, &length)) {
	case 0:
		break;
	case 1:
		if (off)
			*off = length;
		return 1;
	default:
		return -1;
	}
	if (r == NULL) {
		if (off)
			*off = length;
		return 0;
	}
	const char *data = buf + TNT_REPLY_IPROTO_HDR_SIZE;
	size_t data_length = length - TNT_REPLY_IPROTO_HDR_SIZE;
	size_t hdr_length;
	if (tnt_reply_hdr0(r, data, data_length, &hdr_length) != 0)
		return -1;
	if (data_length != hdr_length) {
		if (tnt_reply_body0(r, data + hdr_length, data_length - hdr_length, NULL) != 0)
			return -1;
	}
	if (off)
		*off = length;
	return 0;
}